

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O1

void __thiscall
QDuplicateTracker<QString,_32UL>::QDuplicateTracker(QDuplicateTracker<QString,_32UL> *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  allocator_type local_40;
  key_equal local_31;
  QHasher<QString> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = std::pmr::get_default_resource();
  *(code **)&this->res = log10;
  *(QDuplicateTracker<QString,_32UL> **)&this->field_0x608 = this;
  *(undefined8 *)&this->field_0x610 = 0x600;
  *(undefined8 *)&this->field_0x618 = 0x900;
  *(undefined8 *)&this->field_0x620 = uVar1;
  *(QDuplicateTracker<QString,_32UL> **)&this->field_0x628 = this;
  *(undefined8 *)&this->field_0x630 = 0x600;
  *(undefined8 *)&this->field_0x638 = 0;
  local_30.storedSeed = 0;
  local_40._M_resource = (memory_resource *)&this->res;
  local_30.storedSeed = (size_t)QHashSeed::globalSeed();
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->set)._M_h,0x20,&local_30,&local_31,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}